

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ISXD.cpp
# Opt level: O0

MXFReader * __thiscall
AS_02::ISXD::MXFReader::ReadGenericStreamPartitionPayload
          (MXFReader *this,ui32_t SID,FrameBuffer *frame_buf)

{
  h__Reader *phVar1;
  ulong uVar2;
  AESDecContext *in_RCX;
  undefined4 in_register_00000034;
  long lVar3;
  FrameBuffer *frame_buf_local;
  ui32_t SID_local;
  MXFReader *this_local;
  
  lVar3 = CONCAT44(in_register_00000034,SID);
  phVar1 = ASDCP::mem_ptr::operator_cast_to_h__Reader_((mem_ptr *)(lVar3 + 8));
  if (phVar1 != (h__Reader *)0x0) {
    phVar1 = ASDCP::mem_ptr<AS_02::ISXD::MXFReader::h__Reader>::operator->
                       ((mem_ptr<AS_02::ISXD::MXFReader::h__Reader> *)(lVar3 + 8));
    uVar2 = (**(code **)(*(long *)(phVar1->super_h__AS02Reader).
                                  super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>
                                  .m_File + 0x40))();
    if ((uVar2 & 1) != 0) {
      phVar1 = ASDCP::mem_ptr<AS_02::ISXD::MXFReader::h__Reader>::operator->
                         ((mem_ptr<AS_02::ISXD::MXFReader::h__Reader> *)(lVar3 + 8));
      ASDCP::MXF::TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>::
      ReadGenericStreamPartitionPayload
                ((TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader> *)this,
                 (ui32_t)phVar1,(FrameBuffer *)((ulong)frame_buf & 0xffffffff),in_RCX,
                 (HMACContext *)0x0);
      return this;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  return this;
}

Assistant:

Result_t
AS_02::ISXD::MXFReader::ReadGenericStreamPartitionPayload(const ui32_t SID, ASDCP::FrameBuffer& frame_buf)
{
  if ( m_Reader && m_Reader->m_File->IsOpen() )
    {
      return m_Reader->ReadGenericStreamPartitionPayload(SID, frame_buf, 0, 0 /*no encryption*/);
    }

  return RESULT_INIT;
}